

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O0

ly_write_clb ly_out_clb(ly_out *out,ly_write_clb writeclb)

{
  ly_write_clb prev_clb;
  ly_write_clb writeclb_local;
  ly_out *out_local;
  
  if (out == (ly_out *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","out","ly_out_clb");
    out_local = (ly_out *)0x0;
  }
  else if (out->type == LY_OUT_CALLBACK) {
    out_local = (ly_out *)(out->method).f;
    if (writeclb != (ly_write_clb)0x0) {
      (out->method).clb.func = writeclb;
    }
  }
  else {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
           "out->type == LY_OUT_CALLBACK","ly_out_clb");
    out_local = (ly_out *)0x0;
  }
  return (ly_write_clb)out_local;
}

Assistant:

LIBYANG_API_DEF ly_write_clb
ly_out_clb(struct ly_out *out, ly_write_clb writeclb)
{
    ly_write_clb prev_clb;

    LY_CHECK_ARG_RET(NULL, out, out->type == LY_OUT_CALLBACK, NULL);

    prev_clb = out->method.clb.func;

    if (writeclb) {
        out->method.clb.func = writeclb;
    }

    return prev_clb;
}